

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int array_container_to_uint32_array(void *vout,array_container_t *cont,uint32_t base)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 2) != 0) {
    iVar2 = avx512_array_container_to_uint32_array(vout,cont->array,(long)cont->cardinality,base);
    return iVar2;
  }
  if ((uVar1 & 1) != 0) {
    iVar2 = array_container_to_uint32_array_vector16(vout,cont->array,(long)cont->cardinality,base);
    return iVar2;
  }
  if (cont->cardinality == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      *(uint *)((long)vout + uVar3 * 4) = cont->array[uVar3] + base;
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)(long)cont->cardinality);
  }
  return (int)uVar3;
}

Assistant:

ALLOW_UNALIGNED
int array_container_to_uint32_array(void *vout, const array_container_t *cont,
                                    uint32_t base) {
#if CROARING_IS_X64
    int support = croaring_hardware_support();
#if CROARING_COMPILER_SUPPORTS_AVX512
    if (support & ROARING_SUPPORTS_AVX512) {
        return avx512_array_container_to_uint32_array(vout, cont->array,
                                                      cont->cardinality, base);
    }
#endif
    if (support & ROARING_SUPPORTS_AVX2) {
        return array_container_to_uint32_array_vector16(
            vout, cont->array, cont->cardinality, base);
    }
#endif  // CROARING_IS_X64
    int outpos = 0;
    uint32_t *out = (uint32_t *)vout;
    size_t i = 0;
    for (; i < (size_t)cont->cardinality; ++i) {
        const uint32_t val = base + cont->array[i];
        memcpy(out + outpos, &val,
               sizeof(uint32_t));  // should be compiled as a MOV on x64
        outpos++;
    }
    return outpos;
}